

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O0

void test_ht_2(void)

{
  _Bool _Var1;
  _Bool _Var2;
  spki_record *record;
  spki_record *record_00;
  long in_FS_OFFSET;
  spki_record *record2;
  spki_record *record1;
  spki_record *psStack_188;
  uint result_len;
  spki_record *result;
  spki_table table;
  
  table.lock._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  record = create_record(10,0x14,0x1e,(rtr_socket *)0x0);
  record_00 = create_record(10,0x14,0x28,(rtr_socket *)0x0);
  spki_table_init((spki_table *)&result,(spki_update_fp)0x0);
  _spki_table_add_assert((spki_table *)&result,record);
  _spki_table_add_assert((spki_table *)&result,record_00);
  spki_table_get_all((spki_table *)&result,10,record->ski,&stack0xfffffffffffffe78,
                     (uint *)((long)&record1 + 4));
  if (record1._4_4_ != 2) {
    __assert_fail("result_len == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xbe,"void test_ht_2(void)");
  }
  _Var1 = spki_records_are_equal(psStack_188,record);
  _Var2 = spki_records_are_equal(psStack_188,record_00);
  if (_Var1 == _Var2) {
    __assert_fail("spki_records_are_equal(&result[0], record1) != spki_records_are_equal(&result[0], record2)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xc1,"void test_ht_2(void)");
  }
  _Var1 = spki_records_are_equal(psStack_188 + 1,record);
  _Var2 = spki_records_are_equal(psStack_188 + 1,record_00);
  if (_Var1 == _Var2) {
    __assert_fail("spki_records_are_equal(&result[1], record1) != spki_records_are_equal(&result[1], record2)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xc2,"void test_ht_2(void)");
  }
  free(psStack_188);
  _spki_table_remove_assert((spki_table *)&result,record);
  spki_table_get_all((spki_table *)&result,10,record->ski,&stack0xfffffffffffffe78,
                     (uint *)((long)&record1 + 4));
  if (record1._4_4_ != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,200,"void test_ht_2(void)");
  }
  _Var1 = spki_records_are_equal(psStack_188,record_00);
  if (!_Var1) {
    __assert_fail("spki_records_are_equal(&result[0], record2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xc9,"void test_ht_2(void)");
  }
  free(psStack_188);
  _spki_table_remove_assert((spki_table *)&result,record_00);
  spki_table_get_all((spki_table *)&result,10,record->ski,&stack0xfffffffffffffe78,
                     (uint *)((long)&record1 + 4));
  if (record1._4_4_ != 0) {
    __assert_fail("result_len == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xcf,"void test_ht_2(void)");
  }
  if (psStack_188 != (spki_record *)0x0) {
    __assert_fail("!result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xd0,"void test_ht_2(void)");
  }
  spki_table_get_all((spki_table *)&result,10,record_00->ski,&stack0xfffffffffffffe78,
                     (uint *)((long)&record1 + 4));
  if (record1._4_4_ == 0) {
    if (psStack_188 != (spki_record *)0x0) {
      __assert_fail("!result",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0xd3,"void test_ht_2(void)");
    }
    free(record);
    free(record_00);
    spki_table_free((spki_table *)&result);
    printf("%s() complete\n","test_ht_2");
    if (*(long *)(in_FS_OFFSET + 0x28) == table.lock._48_8_) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("result_len == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                ,0xd2,"void test_ht_2(void)");
}

Assistant:

static void test_ht_2(void)
{
	struct spki_table table;
	struct spki_record *result;
	unsigned int result_len;
	/* create 2 distinct records */
	struct spki_record *record1 = create_record(10, 20, 30, NULL);
	struct spki_record *record2 = create_record(10, 20, 40, NULL);
	/* TEST1: verify 2 diff SPKIs hash to the same SKI */
	spki_table_init(&table, NULL);
	_spki_table_add_assert(&table, record1);
	_spki_table_add_assert(&table, record2);
	spki_table_get_all(&table, 10, record1->ski, &result, &result_len);
	assert(result_len == 2);

	/* TEST2: check that returned records are the same we added. */
	assert(spki_records_are_equal(&result[0], record1) != spki_records_are_equal(&result[0], record2));
	assert(spki_records_are_equal(&result[1], record1) != spki_records_are_equal(&result[1], record2));
	free(result);

	/* TEST3: remove record1 and verify result is record2 */
	_spki_table_remove_assert(&table, record1);
	spki_table_get_all(&table, 10, record1->ski, &result, &result_len);
	assert(result_len == 1);
	assert(spki_records_are_equal(&result[0], record2));
	free(result);

	/*TEST4: remove record2 and verify search result is empty */
	_spki_table_remove_assert(&table, record2);
	spki_table_get_all(&table, 10, record1->ski, &result, &result_len);
	assert(result_len == 0);
	assert(!result);
	spki_table_get_all(&table, 10, record2->ski, &result, &result_len);
	assert(result_len == 0);
	assert(!result);

	/* cleanup: free memory */
	free(record1);
	free(record2);
	spki_table_free(&table);
	printf("%s() complete\n", __func__);
}